

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::enum_to_stem_string::groupingStrategy
               (UGroupingStrategy value,UnicodeString *sb)

{
  switch(value) {
  case UNUM_GROUPING_OFF:
    icu_63::UnicodeString::doAppend(sb,L"group-off",0,-1);
    break;
  case UNUM_GROUPING_MIN2:
    icu_63::UnicodeString::doAppend(sb,L"group-min2",0,-1);
    break;
  case UNUM_GROUPING_AUTO:
    icu_63::UnicodeString::doAppend(sb,L"group-auto",0,-1);
    break;
  case UNUM_GROUPING_ON_ALIGNED:
    icu_63::UnicodeString::doAppend(sb,L"group-on-aligned",0,-1);
    break;
  case UNUM_GROUPING_THOUSANDS:
    icu_63::UnicodeString::doAppend(sb,L"group-thousands",0,-1);
  }
  return;
}

Assistant:

void enum_to_stem_string::groupingStrategy(UGroupingStrategy value, UnicodeString& sb) {
    switch (value) {
        case UNUM_GROUPING_OFF:
            sb.append(u"group-off", -1);
            break;
        case UNUM_GROUPING_MIN2:
            sb.append(u"group-min2", -1);
            break;
        case UNUM_GROUPING_AUTO:
            sb.append(u"group-auto", -1);
            break;
        case UNUM_GROUPING_ON_ALIGNED:
            sb.append(u"group-on-aligned", -1);
            break;
        case UNUM_GROUPING_THOUSANDS:
            sb.append(u"group-thousands", -1);
            break;
        default:
            U_ASSERT(false);
    }
}